

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

Classifier __thiscall CLI::App::_recognize(App *this,string *current,bool ignore_used_subcommands)

{
  App **ppAVar1;
  pointer __s;
  bool bVar2;
  int iVar3;
  Classifier CVar4;
  App *pAVar5;
  Option *pOVar6;
  void *pvVar7;
  size_type __n;
  App *pAVar8;
  Classifier CVar9;
  string dummy1;
  string dummy2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  size_type local_78;
  string local_70;
  string local_50;
  
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (current,"--");
  pAVar8 = this;
  if (iVar3 == 0) {
    CVar9 = POSITIONAL_MARK;
    goto LAB_001999d4;
  }
  do {
    if (((pAVar8->require_subcommand_max_ == 0) ||
        ((ulong)((long)(pAVar8->parsed_subcommands_).
                       super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pAVar8->parsed_subcommands_).
                       super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) < pAVar8->require_subcommand_max_)) &&
       (pAVar5 = _find_subcommand(pAVar8,current,true,ignore_used_subcommands), pAVar5 != (App *)0x0
       )) {
      CVar9 = SUBCOMMAND;
      goto LAB_001999d4;
    }
    ppAVar1 = &pAVar8->parent_;
    pAVar8 = *ppAVar1;
  } while (*ppAVar1 != (App *)0x0);
  bVar2 = detail::split_long(current,&local_98,&local_70);
  CVar9 = LONG;
  if (bVar2) goto LAB_001999d4;
  bVar2 = detail::split_short(current,&local_98,&local_70);
  if (bVar2) {
    if ((byte)(*local_98._M_dataplus._M_p - 0x30U) < 10) {
      local_50.field_2._M_allocated_capacity._0_2_ =
           (ushort)(byte)*local_98._M_dataplus._M_p << 8 | 0x2d;
      local_50._M_string_length = 2;
      local_50.field_2._M_local_buf[2] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pOVar6 = get_option_no_throw(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT53(local_50.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_50.field_2._M_local_buf[2],
                                          local_50.field_2._M_allocated_capacity._0_2_)) + 1);
      }
      if (pOVar6 == (Option *)0x0) goto LAB_001999d1;
    }
    CVar9 = SHORT;
  }
  else {
    if (this->allow_windows_style_options_ == true) {
      bVar2 = detail::split_windows_style(current,&local_98,&local_70);
      CVar9 = WINDOWS_STYLE;
      if (bVar2) goto LAB_001999d4;
    }
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (current,"++");
    if (((iVar3 == 0) && ((this->name_)._M_string_length != 0)) &&
       (CVar9 = SUBCOMMAND_TERMINATOR, this->parent_ != (App *)0x0)) goto LAB_001999d4;
    if (current->_M_string_length != 0) {
      __s = (current->_M_dataplus)._M_p;
      pvVar7 = memchr(__s,0x2e,current->_M_string_length);
      __n = (long)pvVar7 - (long)__s;
      if (__n != 0xffffffffffffffff && pvVar7 != (void *)0x0) {
        local_78 = __n;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_b8,current,0,__n);
        pAVar8 = _find_subcommand(this,&local_b8,true,ignore_used_subcommands);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (pAVar8 != (App *)0x0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_b8,current,local_78 + 1,0xffffffffffffffff);
          CVar4 = _recognize(pAVar8,&local_b8,ignore_used_subcommands);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          CVar9 = SUBCOMMAND;
          if (CVar4 == SUBCOMMAND) goto LAB_001999d4;
        }
      }
    }
LAB_001999d1:
    CVar9 = NONE;
  }
LAB_001999d4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return CVar9;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE detail::Classifier App::_recognize(const std::string &current,
                                                                bool ignore_used_subcommands) const {
    std::string dummy1, dummy2;

    if(current == "--")
        return detail::Classifier::POSITIONAL_MARK;
    if(_valid_subcommand(current, ignore_used_subcommands))
        return detail::Classifier::SUBCOMMAND;
    if(detail::split_long(current, dummy1, dummy2))
        return detail::Classifier::LONG;
    if(detail::split_short(current, dummy1, dummy2)) {
        if(dummy1[0] >= '0' && dummy1[0] <= '9') {
            if(get_option_no_throw(std::string{'-', dummy1[0]}) == nullptr) {
                return detail::Classifier::NONE;
            }
        }
        return detail::Classifier::SHORT;
    }
    if((allow_windows_style_options_) && (detail::split_windows_style(current, dummy1, dummy2)))
        return detail::Classifier::WINDOWS_STYLE;
    if((current == "++") && !name_.empty() && parent_ != nullptr)
        return detail::Classifier::SUBCOMMAND_TERMINATOR;
    auto dotloc = current.find_first_of('.');
    if(dotloc != std::string::npos) {
        auto *cm = _find_subcommand(current.substr(0, dotloc), true, ignore_used_subcommands);
        if(cm != nullptr) {
            auto res = cm->_recognize(current.substr(dotloc + 1), ignore_used_subcommands);
            if(res == detail::Classifier::SUBCOMMAND) {
                return res;
            }
        }
    }
    return detail::Classifier::NONE;
}